

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_segment.hpp
# Opt level: O0

void __thiscall
ELFIO::segment_impl<ELFIO::Elf32_Phdr>::segment_impl
          (segment_impl<ELFIO::Elf32_Phdr> *this,endianness_convertor *convertor,
          address_translator *translator)

{
  address_translator *translator_local;
  endianness_convertor *convertor_local;
  segment_impl<ELFIO::Elf32_Phdr> *this_local;
  
  segment::segment(&this->super_segment);
  (this->super_segment)._vptr_segment = (_func_int **)&PTR__segment_impl_0011dc88;
  this->pstream = (istream *)0x0;
  (this->ph).p_type = 0;
  (this->ph).p_offset = 0;
  (this->ph).p_vaddr = 0;
  (this->ph).p_paddr = 0;
  (this->ph).p_filesz = 0;
  (this->ph).p_memsz = 0;
  (this->ph).p_flags = 0;
  (this->ph).p_align = 0;
  this->index = 0;
  std::unique_ptr<char[],std::default_delete<char[]>>::unique_ptr<std::default_delete<char[]>,void>
            ((unique_ptr<char[],std::default_delete<char[]>> *)&this->data);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->sections);
  this->convertor = convertor;
  this->translator = translator;
  this->stream_size = 0;
  this->is_offset_set = false;
  this->is_lazy = false;
  this->is_loaded = false;
  return;
}

Assistant:

segment_impl( const endianness_convertor* convertor,
                  const address_translator*   translator )
        : convertor( convertor ), translator( translator )
    {
    }